

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O1

bool __thiscall
iDynTree::Model::updateInertialParameters(Model *this,VectorDynSize *modelInertialParams)

{
  long lVar1;
  SpatialInertia *pSVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  Vector10 inertiaParamsBuf;
  
  lVar1 = iDynTree::VectorDynSize::size();
  lVar3 = ((long)(this->links).super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->links).super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 4) * 0x4924924924924926;
  if (lVar1 == lVar3) {
    if ((this->links).super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (this->links).super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>._M_impl.
        super__Vector_impl_data._M_start) {
      lVar4 = 0;
      uVar5 = 0;
      do {
        iDynTree::VectorDynSize::data();
        iDynTree::VectorDynSize::size();
        pSVar2 = Link::inertia((Link *)((long)(((this->links).
                                                super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                              m_inertia).m_mcom + lVar4 + 0xfffffffffffffff0U));
        iDynTree::SpatialInertia::fromVector((VectorFixSize *)pSVar2);
        uVar5 = uVar5 + 1;
        lVar4 = lVar4 + 0x70;
      } while (uVar5 < (ulong)(((long)(this->links).
                                      super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->links).
                                      super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 4) *
                              0x6db6db6db6db6db7));
    }
  }
  else {
    iDynTree::reportError
              ("Model","updateInertialParameters",
               "modelInertialParams has the wrong number of parameters");
  }
  return lVar1 == lVar3;
}

Assistant:

bool Model::updateInertialParameters(const VectorDynSize& modelInertialParams)
{
    if( modelInertialParams.size() != this->getNrOfLinks()*10 )
    {
        reportError("Model","updateInertialParameters","modelInertialParams has the wrong number of parameters");
        return false;
    }

    for(LinkIndex linkIdx = 0; linkIdx < this->getNrOfLinks(); linkIdx++ )
    {
        Vector10       inertiaParamsBuf;
        toEigen(inertiaParamsBuf) = toEigen(modelInertialParams).segment<10>(10*linkIdx);

        links[linkIdx].inertia().fromVector(inertiaParamsBuf);
    }

    return true;
}